

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

void __thiscall wasm::BranchUtils::BranchTargets::~BranchTargets(BranchTargets *this)

{
  BranchTargets *this_local;
  
  Inner::~Inner(&this->inner);
  return;
}

Assistant:

BranchTargets(Expression* expr) { inner.walk(expr); }